

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
::
Insert<(JsUtil::SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>::InsertOperations)2>
          (SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
           *this,TBKey *key,TBValue *value)

{
  SplitWeakDictionary<bool,Js::RecyclableObject*,true,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::NoResizeLock,Memory::Recycler>
  *pSVar1;
  uint uVar2;
  TBKey pRVar3;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  undefined4 *puVar9;
  long lVar10;
  uint key_00;
  uint last;
  uint i;
  int iVar11;
  long lVar12;
  hash_t local_34;
  
  lVar12 = *(long *)(this + 8);
  if (lVar12 == 0) {
    SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
    ::Initialize((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  *)this,0);
    lVar12 = *(long *)(this + 8);
  }
  key_00 = (uint)((ulong)*key >> 4) & 0x7fffffff;
  local_34 = PrimePolicy::ModPrime(key_00,*(uint *)(this + 0x2c),*(int *)(this + 0x3c));
  i = *(uint *)(lVar12 + (ulong)local_34 * 4);
  if (-1 < (int)i) {
    lVar12 = *(long *)(this + 0x10);
    last = 0xffffffff;
    do {
      uVar8 = (ulong)i;
      pRVar3 = *(TBKey *)(*(long *)(this + 0x18) + uVar8 * 0x10);
      if (pRVar3 == (TBKey)0x0) {
        uVar2 = *(uint *)(*(long *)(this + 0x10) + 4 + uVar8 * 8);
        SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
        ::RemoveAt((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                    *)this,i,last,local_34);
      }
      else {
        if (pRVar3 == *key) {
          *(TBValue *)(*(long *)(this + 0x10) + uVar8 * 8) = *value;
          return i;
        }
        uVar2 = *(uint *)(lVar12 + 4 + uVar8 * 8);
        last = i;
      }
      i = uVar2;
    } while (-1 < (int)i);
  }
  iVar7 = *(int *)(this + 0x38);
  if (iVar7 == 0) {
    if (*(int *)(this + 0x30) == *(int *)(this + 0x28)) {
      (*(code *)**(undefined8 **)this)(this);
      iVar7 = *(int *)(this + 0x38);
      if (iVar7 != 0) goto LAB_00d27f70;
    }
    iVar7 = *(int *)(this + 0x28);
    iVar11 = *(int *)(this + 0x30);
    if (iVar11 == iVar7) {
      SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
      ::Resize((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                *)this);
      local_34 = PrimePolicy::ModPrime(key_00,*(uint *)(this + 0x2c),*(int *)(this + 0x3c));
      iVar7 = *(int *)(this + 0x28);
      iVar11 = *(int *)(this + 0x30);
    }
    *(int *)(this + 0x30) = iVar11 + 1;
    if (iVar7 < iVar11 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x2ba,"(count <= size)","count <= size");
      if (!bVar6) goto LAB_00d2826c;
      *puVar9 = 0;
      iVar7 = *(int *)(this + 0x28);
    }
    if (iVar7 <= iVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,699,"(index < size)","index < size");
      if (!bVar6) goto LAB_00d2826c;
      *puVar9 = 0;
    }
  }
  else {
LAB_00d27f70:
    if (iVar7 < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x29d,"(freeCount > 0)","freeCount > 0");
      if (!bVar6) goto LAB_00d2826c;
      *puVar9 = 0;
    }
    iVar11 = *(int *)(this + 0x34);
    if (iVar11 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x29e,"(freeList >= 0)","freeList >= 0");
      if (!bVar6) goto LAB_00d2826c;
      *puVar9 = 0;
      iVar11 = *(int *)(this + 0x34);
    }
    if (*(int *)(this + 0x30) <= iVar11) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                         ,0x29f,"(freeList < count)","freeList < count");
      if (!bVar6) goto LAB_00d2826c;
      *puVar9 = 0;
      iVar11 = *(int *)(this + 0x34);
    }
    pSVar1 = this + 0x38;
    *(int *)pSVar1 = *(int *)pSVar1 + -1;
    if (*(int *)pSVar1 != 0) {
      lVar12 = *(long *)(this + 0x10);
      iVar7 = *(int *)(lVar12 + 4 + (long)iVar11 * 8);
      if (-2 < iVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                           ,0x1a9,"(IsFreeEntry(freeEntry))","IsFreeEntry(freeEntry)");
        if (!bVar6) {
LAB_00d2826c:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar9 = 0;
        iVar7 = *(int *)(lVar12 + 4 + (long)iVar11 * 8);
      }
      *(int *)(this + 0x34) = -2 - iVar7;
    }
  }
  lVar10 = (long)iVar11;
  Memory::RecyclerWeakReferenceRegionItem<Js::RecyclableObject_*>::operator=
            ((RecyclerWeakReferenceRegionItem<Js::RecyclableObject_*> *)
             (lVar10 * 0x10 + *(long *)(this + 0x18)),*key);
  lVar12 = *(long *)(this + 0x10);
  *(TBValue *)(lVar12 + lVar10 * 8) = *value;
  lVar4 = *(long *)(this + 8);
  *(undefined4 *)(lVar12 + 4 + lVar10 * 8) = *(undefined4 *)(lVar4 + (ulong)local_34 * 4);
  *(int *)(lVar4 + (ulong)local_34 * 4) = iVar11;
  return iVar11;
}

Assistant:

int Insert(const TBKey& key, const TBValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCodeWithKey<TBKey>(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket], last = -1; i >= 0;)
                {
                    TBKey k = this->GetKey(i);
                    if (this->RemoveIfCollected(k, &i, last, targetBucket))
                    {
                        continue;
                    }

                    if (Comparer<TBKey>::Equals(k, key))
                    {
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            SetValue(value, i);
                            return i;
                        }
                        return -1;
                    }

                    last = i;
                    i = localEntries[i].next;
                }
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (freeCount == 0 && count == size)
            {
                this->Cleanup();
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if (freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            SetKeyValue(key, value, index);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

            return index;
        }